

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# replay.c
# Opt level: O1

void replay_commandloop(wchar_t fd)

{
  char cVar1;
  wchar_t wVar2;
  int iVar3;
  size_t sVar4;
  long lVar5;
  wchar_t count;
  hp_time t_end;
  hp_time t_start;
  nh_cmd_desc *cmd;
  nh_cmd_arg noarg;
  nh_replay_info rinfo;
  char qbuf [256];
  char buf [256];
  char buf_1 [256];
  int local_3c4;
  timeval local_3c0;
  timeval local_3b0;
  wchar_t local_3a0;
  int local_39c;
  nh_cmd_desc *local_398;
  nh_cmd_arg local_390;
  nh_replay_info local_388;
  char local_338 [256];
  char local_238 [256];
  char local_138 [264];
  
  create_game_windows();
  reset_old_status();
  local_3a0 = fd;
  cVar1 = nh_view_replay_start(fd,&curses_replay_windowprocs,&local_388);
  if (cVar1 == '\0') {
    return;
  }
  load_keymap();
  draw_msgwin();
  curses_update_status((nh_player_info *)0x0);
  draw_sidebar();
  draw_replay_info(&local_388);
  curses_display_menu((nh_menuitem_conflict *)&show_replay_help_items,L'\x06',"Replay help:",L'\0',
                      (wchar_t *)0x0);
  do {
    update_old_status();
    wVar2 = get_map_key(L'\x01');
    if (wVar2 < L'Ą') {
      if (wVar2 == L' ') {
LAB_00114ced:
        cVar1 = nh_view_replay_step(&local_388,0,1);
        draw_replay_info(&local_388);
        if ((cVar1 == '\0') &&
           (wVar2 = curses_msgwin(
                                 "You have reached the end of this game. Go back or press ESC to exit."
                                 ), wVar2 == L'\x1b')) goto LAB_00115060;
      }
      else if (wVar2 == L'g') {
        strncpy(local_338,"What move do you want to jump to?",0x100);
        iVar3 = local_388.max_moves;
        if (0 < local_388.max_moves) {
          sVar4 = strlen(local_338);
          sprintf(local_338 + sVar4," (Max: %d)",(ulong)(uint)iVar3);
        }
        curses_getline(local_338,local_238);
        if ((local_238[0] != '\x1b') && (iVar3 = atoi(local_238), iVar3 != 0)) {
          nh_view_replay_step(&local_388,2,iVar3);
        }
      }
      else {
        if (wVar2 == L'\x1b') {
LAB_00115060:
          nh_view_replay_finish();
          free_keymap();
          destroy_game_windows();
          cleanup_messages();
          return;
        }
LAB_00114fe9:
        local_3c4 = 0;
        local_390.argtype = 2;
        local_398 = keymap[wVar2];
        if (local_398 != (nh_cmd_desc *)0x0) {
          if ((int)local_398->flags < 0) {
            handle_internal_cmd(&local_398,&local_390,&local_3c4);
          }
          if (local_398 != (nh_cmd_desc *)0x0) {
            nh_command(local_398,local_3c4,&local_390);
          }
        }
      }
    }
    else if (wVar2 == L'Ą') {
      nh_view_replay_step(&local_388,1,1);
      draw_replay_info(&local_388);
    }
    else {
      if (wVar2 != L'Ĕ') {
        if (wVar2 != L'ą') goto LAB_00114fe9;
        goto LAB_00114ced;
      }
      local_39c = local_388.moves;
      nh_view_replay_step(&local_388,2,0);
      gettimeofday(&local_3b0,(__timezone_ptr_t)0x0);
      while (local_388.actions < local_388.max_actions) {
        nh_view_replay_step(&local_388,0,1);
        curses_update_status((nh_player_info *)0x0);
        draw_replay_info(&local_388);
        doupdate();
      }
      draw_msgwin();
      gettimeofday(&local_3c0,(__timezone_ptr_t)0x0);
      lVar5 = (local_3c0.tv_usec - local_3b0.tv_usec) / 1000 +
              (local_3c0.tv_sec - local_3b0.tv_sec) * 1000;
      snprintf(local_138,0x100,"%d actions replayed with display in %ld ms. (%ld actions/sec)",
               (long)local_388.max_actions,lVar5,((long)local_388.max_actions * 1000) / lVar5);
      curses_msgwin(local_138);
      iVar3 = local_388.moves;
      nh_view_replay_finish();
      nh_view_replay_start(local_3a0,&curses_replay_windowprocs,&local_388);
      gettimeofday(&local_3b0,(__timezone_ptr_t)0x0);
      nh_view_replay_step(&local_388,2,iVar3);
      gettimeofday(&local_3c0,(__timezone_ptr_t)0x0);
      lVar5 = (local_3c0.tv_usec - local_3b0.tv_usec) / 1000 +
              (local_3c0.tv_sec - local_3b0.tv_sec) * 1000;
      snprintf(local_138,0x100,"%d actions replayed without display in %ld ms. (%ld actions/sec)",
               (long)local_388.actions,lVar5,((long)local_388.actions * 1000) / lVar5);
      curses_msgwin(local_138);
      iVar3 = local_388.actions;
      gettimeofday(&local_3b0,(__timezone_ptr_t)0x0);
      if (iVar3 < local_388.actions + 1000 && 0 < local_388.actions) {
        do {
          nh_view_replay_step(&local_388,1,1);
          curses_update_status((nh_player_info *)0x0);
          draw_msgwin();
          draw_replay_info(&local_388);
          doupdate();
          if (local_388.actions < 1) break;
        } while (iVar3 < local_388.actions + 1000);
      }
      gettimeofday(&local_3c0,(__timezone_ptr_t)0x0);
      lVar5 = (local_3c0.tv_usec - local_3b0.tv_usec) / 1000 +
              (local_3c0.tv_sec - local_3b0.tv_sec) * 1000;
      snprintf(local_138,0x100,
               "%d actions replayed backward with display in %ld ms. (%ld actions/sec)",
               (long)iVar3 - (long)local_388.actions & 0xffffffff,lVar5,
               (((long)iVar3 - (long)local_388.actions) * 1000) / lVar5);
      curses_msgwin(local_138);
      nh_view_replay_step(&local_388,2,local_39c);
    }
    draw_msgwin();
    curses_update_status((nh_player_info *)0x0);
    draw_sidebar();
    draw_replay_info(&local_388);
  } while( true );
}

Assistant:

void replay_commandloop(int fd)
{
    int key, move, count;
    char buf[BUFSZ], qbuf[BUFSZ];
    nh_bool ret, firsttime = TRUE;
    struct nh_replay_info rinfo;
    struct nh_cmd_arg noarg;
    struct nh_cmd_desc *cmd;
    
    create_game_windows();
    reset_old_status();
    if (!nh_view_replay_start(fd, &curses_replay_windowprocs, &rinfo))
	return;
    load_keymap();
    
    while (1) {
	draw_msgwin();
	curses_update_status(NULL);
	draw_sidebar();
	draw_replay_info(&rinfo);
	if (firsttime)
	    show_replay_help();
	firsttime = FALSE;
	update_old_status();

	key = get_map_key(TRUE);
	switch (key) {
	    /* step forward */
	    case KEY_RIGHT:
	    case ' ':
		ret = nh_view_replay_step(&rinfo, REPLAY_FORWARD, 1);
		draw_replay_info(&rinfo);
		if (ret == FALSE) {
		    key = curses_msgwin("You have reached the end of this game. "
		                        "Go back or press ESC to exit.");
		    if (key == KEY_ESC)
			goto out;
		}
		break;
		
	    /* step backward */
	    case KEY_LEFT:
		nh_view_replay_step(&rinfo, REPLAY_BACKWARD, 1);
		draw_replay_info(&rinfo);
		break;
		
	    case KEY_ESC:
		goto out;

	    case 'g':
		strncpy(qbuf, "What move do you want to jump to?", BUFSZ);
		if (rinfo.max_moves > 0)
		    sprintf(qbuf + strlen(qbuf), " (Max: %d)", rinfo.max_moves);
		
		curses_getline(qbuf, buf);
		if (buf[0] == '\033' || !(move = atoi(buf)))
		    break;
		nh_view_replay_step(&rinfo, REPLAY_GOTO, move);
		break;

	    case KEY_F(12): /* timetest! */
		if (allow_timetest())
		    timetest(fd, &rinfo);
		break;
		
	    default:
		count = 0;
		noarg.argtype = CMD_ARG_NONE;
		cmd = keymap[key];
		if (!cmd)
		    break;
		if (cmd->flags & CMD_UI)
		    handle_internal_cmd(&cmd, &noarg, &count);
		if (cmd)
		    nh_command(cmd->name, count, &noarg);
		break;
	}
    }
    
out:
    nh_view_replay_finish();
    free_keymap();
    destroy_game_windows();
    cleanup_messages();
}